

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpo.c
# Opt level: O0

Rpo_LCI_Edge_t * Rpo_CreateEdge(Operator_t op,int i,int j,int *vertexDegree)

{
  Rpo_LCI_Edge_t *pRVar1;
  Rpo_LCI_Edge_t *edge;
  int *vertexDegree_local;
  int j_local;
  int i_local;
  Operator_t op_local;
  
  pRVar1 = (Rpo_LCI_Edge_t *)malloc(8);
  *pRVar1 = (Rpo_LCI_Edge_t)((ulong)*pRVar1 & 0xfffffffffffffff9 | ((ulong)op & 3) << 1);
  *pRVar1 = (Rpo_LCI_Edge_t)((ulong)*pRVar1 & 0xfffffffc0000000f | ((long)i & 0x3fffffffU) << 4);
  *pRVar1 = (Rpo_LCI_Edge_t)((ulong)*pRVar1 & 0x3ffffffff | (long)j << 0x22);
  *pRVar1 = (Rpo_LCI_Edge_t)((ulong)*pRVar1 & 0xfffffffffffffffe);
  vertexDegree[i] = vertexDegree[i] + 1;
  vertexDegree[j] = vertexDegree[j] + 1;
  return pRVar1;
}

Assistant:

Rpo_LCI_Edge_t* Rpo_CreateEdge(Operator_t op, int i, int j, int* vertexDegree) {
    Rpo_LCI_Edge_t* edge = ABC_ALLOC(Rpo_LCI_Edge_t, 1);
    edge->connectionType = op;
    edge->idx1 = i;
    edge->idx2 = j;
    edge->visited = 0;
    vertexDegree[i]++;
    vertexDegree[j]++;
    return edge;
}